

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ImageFeatureType::MergePartialFromCodedStream
          (ImageFeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  unsigned_long uVar9;
  ImageFeatureType_EnumeratedImageSizes *this_00;
  ImageFeatureType_ImageSizeRange *this_01;
  pair<int,_int> pVar10;
  char cVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  
LAB_001c7a43:
  pbVar3 = input->buffer_;
  uVar8 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar8 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
      goto LAB_001c7cdd;
      uVar12 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_001c7cdd:
    uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar12 = 0;
    if (uVar8 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar8 | uVar12;
  }
  uVar8 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) != 0) {
    uVar6 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (2 < uVar6) {
      if (uVar6 == 3) {
        if (cVar11 != '\x18') goto LAB_001c7aa0;
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar12 = (ulong)bVar2;
          uVar8 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_001c7d03;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar8 = 0;
LAB_001c7d03:
          uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar12 < 0) {
            return false;
          }
        }
        this->colorspace_ = (int)uVar12;
        goto LAB_001c7a43;
      }
      if (uVar6 == 0x15) {
        if (cVar11 == -0x56) {
          if (this->_oneof_case_[0] == 0x15) {
            this_00 = (this->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            clear_SizeFlexibility(this);
            this->_oneof_case_[0] = 0x15;
            this_00 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
            ImageFeatureType_EnumeratedImageSizes::ImageFeatureType_EnumeratedImageSizes(this_00);
            (this->SizeFlexibility_).enumeratedsizes_ = this_00;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                             (input,iVar7);
          if ((long)pVar10 < 0) {
            return false;
          }
          bVar5 = ImageFeatureType_EnumeratedImageSizes::MergePartialFromCodedStream(this_00,input);
          goto LAB_001c7cc9;
        }
        goto LAB_001c7aa0;
      }
      if ((uVar6 != 0x1f) || (cVar11 != -6)) goto LAB_001c7aa0;
      if (this->_oneof_case_[0] == 0x1f) {
        this_01 = (this->SizeFlexibility_).imagesizerange_;
      }
      else {
        clear_SizeFlexibility(this);
        this->_oneof_case_[0] = 0x1f;
        this_01 = (ImageFeatureType_ImageSizeRange *)operator_new(0x28);
        ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange(this_01);
        (this->SizeFlexibility_).imagesizerange_ = this_01;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar7);
      if ((long)pVar10 < 0) {
        return false;
      }
      bVar5 = ImageFeatureType_ImageSizeRange::MergePartialFromCodedStream(this_01,input);
LAB_001c7cc9:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar10.first);
      goto LAB_001c7ac0;
    }
    if (uVar6 == 1) {
      if (cVar11 != '\b') goto LAB_001c7aa0;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar13.first;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->width_ = uVar9;
      goto LAB_001c7a43;
    }
    if ((uVar6 == 2) && (cVar11 == '\x10')) {
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar13.first;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->height_ = uVar9;
      goto LAB_001c7a43;
    }
  }
LAB_001c7aa0:
  if (uVar8 == 0) {
    return true;
  }
  if ((uVar8 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
LAB_001c7ac0:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_001c7a43;
}

Assistant:

bool ImageFeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ImageFeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 width = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 height = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_colorspace(static_cast< ::CoreML::Specification::ImageFeatureType_ColorSpace >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_enumeratedsizes()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
      case 31: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(250u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imagesizerange()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ImageFeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ImageFeatureType)
  return false;
#undef DO_
}